

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

string * __thiscall
MidiInAlsa::getPortName_abi_cxx11_(string *__return_storage_ptr__,MidiInAlsa *this,uint portNumber)

{
  string *psVar1;
  undefined8 *puVar2;
  snd_seq_t *seq;
  undefined8 uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  snd_seq_port_info_t *__s;
  snd_seq_port_info_t *pinfo;
  undefined8 uStack_200;
  snd_seq_port_info_t asStack_1f8 [8];
  ostringstream local_1f0 [8];
  ostringstream os;
  string local_78 [32];
  string local_58;
  string *local_38;
  
  uStack_200 = 0x10c396;
  lVar7 = snd_seq_client_info_sizeof();
  lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
  __s = asStack_1f8 + lVar7;
  *(undefined8 *)(asStack_1f8 + lVar7 + -8) = 0x10c3ac;
  sVar8 = snd_seq_client_info_sizeof();
  *(undefined8 *)(asStack_1f8 + lVar7 + -8) = 0x10c3b9;
  memset(__s,0,sVar8);
  *(undefined8 *)(asStack_1f8 + lVar7 + -8) = 0x10c3be;
  lVar7 = snd_seq_port_info_sizeof();
  pinfo = __s + -(lVar7 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)(pinfo + -8) = 0x10c3d4;
  sVar8 = snd_seq_port_info_sizeof();
  *(undefined8 *)(pinfo + -8) = 0x10c3e1;
  memset(pinfo,0,sVar8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_38 = __return_storage_ptr__;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar2 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  seq = (snd_seq_t *)*puVar2;
  *(undefined8 *)(pinfo + -8) = 0x21;
  uVar3 = *(undefined8 *)(pinfo + -8);
  *(undefined8 *)(pinfo + -8) = 0x10c40a;
  uVar4 = portInfo(seq,pinfo,(uint)uVar3,portNumber);
  if (uVar4 == 0) {
    psVar1 = &(this->super_MidiInApi).super_MidiApi.errorString_;
    *(undefined8 *)(pinfo + -8) = 0x10c512;
    std::__cxx11::string::assign((char *)psVar1);
    *(undefined8 *)(pinfo + -8) = 0x10c51e;
    std::__cxx11::string::string((string *)&local_58,(string *)psVar1);
    *(undefined8 *)(pinfo + -8) = 0x10c52c;
    MidiApi::error((MidiApi *)this,WARNING,&local_58);
    *(undefined8 *)(pinfo + -8) = 0x10c535;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    *(undefined8 *)(pinfo + -8) = 0x10c41a;
    uVar5 = snd_seq_port_info_get_client(pinfo);
    uVar3 = *puVar2;
    *(undefined8 *)(pinfo + -8) = 0x10c427;
    snd_seq_get_any_client_info(uVar3,uVar5,__s);
    psVar1 = local_38;
    *(undefined8 *)(pinfo + -8) = 0x10c437;
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    *(undefined8 *)(pinfo + -8) = 0x10c43f;
    pcVar9 = (char *)snd_seq_client_info_get_name(__s);
    *(undefined8 *)(pinfo + -8) = 0x10c44e;
    std::operator<<((ostream *)local_1f0,pcVar9);
    *(undefined8 *)(pinfo + -8) = 0x10c461;
    std::operator<<((ostream *)local_1f0,":");
    *(undefined8 *)(pinfo + -8) = 0x10c469;
    pcVar9 = (char *)snd_seq_port_info_get_name(pinfo);
    *(undefined8 *)(pinfo + -8) = 0x10c478;
    std::operator<<((ostream *)local_1f0,pcVar9);
    *(undefined8 *)(pinfo + -8) = 0x10c48b;
    std::operator<<((ostream *)local_1f0," ");
    *(undefined8 *)(pinfo + -8) = 0x10c493;
    iVar6 = snd_seq_port_info_get_client(pinfo);
    *(undefined8 *)(pinfo + -8) = 0x10c4a1;
    std::ostream::operator<<((ostream *)local_1f0,iVar6);
    *(undefined8 *)(pinfo + -8) = 0x10c4b4;
    std::operator<<((ostream *)local_1f0,":");
    *(undefined8 *)(pinfo + -8) = 0x10c4bc;
    iVar6 = snd_seq_port_info_get_port(pinfo);
    *(undefined8 *)(pinfo + -8) = 0x10c4ca;
    std::ostream::operator<<((ostream *)local_1f0,iVar6);
    *(undefined8 *)(pinfo + -8) = 0x10c4da;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)(pinfo + -8) = 0x10c4e9;
    std::__cxx11::string::operator=((string *)psVar1,local_78);
    *(undefined8 *)(pinfo + -8) = 0x10c4f1;
    std::__cxx11::string::~string(local_78);
    *(undefined8 *)(pinfo + -8) = 0x10c4fd;
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
    local_38 = psVar1;
  }
  return local_38;
}

Assistant:

std::string MidiInAlsa :: getPortName( unsigned int portNumber )
{
  snd_seq_client_info_t *cinfo;
  snd_seq_port_info_t *pinfo;
  snd_seq_client_info_alloca( &cinfo );
  snd_seq_port_info_alloca( &pinfo );

  std::string stringName;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) ) {
    int cnum = snd_seq_port_info_get_client( pinfo );
    snd_seq_get_any_client_info( data->seq, cnum, cinfo );
    std::ostringstream os;
    os << snd_seq_client_info_get_name( cinfo );
    os << ":";
    os << snd_seq_port_info_get_name( pinfo );
    os << " ";                                    // These lines added to make sure devices are listed
    os << snd_seq_port_info_get_client( pinfo );  // with full portnames added to ensure individual device names
    os << ":";
    os << snd_seq_port_info_get_port( pinfo );
    stringName = os.str();
    return stringName;
  }

  // If we get here, we didn't find a match.
  errorString_ = "MidiInAlsa::getPortName: error looking for port name!";
  error( RtMidiError::WARNING, errorString_ );
  return stringName;
}